

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O2

string * __thiscall
deqp::sl::ShaderParser::parseShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,ShaderParser *this,char *str)

{
  char *pcVar1;
  byte bVar2;
  char cVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  int iVar8;
  long local_340;
  int local_338;
  ostringstream o;
  ostream local_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&o);
  pcVar7 = str + 1;
  do {
    cVar3 = pcVar7[1];
    pcVar7 = pcVar7 + 1;
  } while (cVar3 == ' ');
  while ((cVar3 == '\n' || (cVar3 == '\r'))) {
    pcVar1 = pcVar7 + 1;
    pcVar7 = pcVar7 + 1;
    cVar3 = *pcVar1;
  }
  do {
    if (cVar3 == '\\') {
      cVar3 = pcVar7[1];
      if (cVar3 != '\0') {
        if (cVar3 == 'n') {
          cVar3 = '\n';
        }
        else if (cVar3 == 't') {
          cVar3 = '\t';
        }
        std::operator<<(&o.super_basic_ostream<char,_std::char_traits<char>_>,cVar3);
      }
      pcVar7 = pcVar7 + 2;
    }
    else {
      if ((cVar3 == '\"') && (pcVar7[1] == '\"')) break;
      std::operator<<(&o.super_basic_ostream<char,_std::char_traits<char>_>,cVar3);
      pcVar7 = pcVar7 + 1;
    }
    cVar3 = *pcVar7;
  } while( true );
  std::__cxx11::stringbuf::str();
  lVar4 = 0;
  iVar8 = 0;
  while( true ) {
    bVar2 = *(byte *)(local_340 + lVar4);
    if ((((0x20 < (ulong)bVar2) || ((0x100002200U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) &&
        (bVar2 != 10)) || (local_338 <= lVar4)) break;
    iVar8 = iVar8 + (uint)(bVar2 == 9) * 3 + 1;
    lVar4 = lVar4 + 1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  iVar6 = 0;
  bVar2 = 1;
  iVar5 = 0;
  do {
    if (local_338 <= iVar5) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&o);
      return __return_storage_ptr__;
    }
    cVar3 = *(char *)(local_340 + iVar5);
    if ((bool)(bVar2 & iVar6 < iVar8)) {
      if (cVar3 != ' ') {
        if (cVar3 == '\n') goto LAB_00d620fe;
        if (cVar3 == '\r') goto LAB_00d620e0;
        if (cVar3 != '\t') goto LAB_00d62110;
      }
      iVar6 = iVar6 + (uint)(cVar3 == '\t') * 3 + 1;
LAB_00d6210c:
      bVar2 = 1;
    }
    else {
      if (cVar3 == '\n') {
LAB_00d620fe:
        std::operator<<(&local_1a8,cVar3);
        iVar6 = 0;
        goto LAB_00d6210c;
      }
      if (cVar3 == '\r') {
LAB_00d620e0:
        if (*(char *)(local_340 + 1 + (long)iVar5) != '\n') goto LAB_00d620fe;
        std::operator<<(&local_1a8,'\n');
        iVar5 = iVar5 + 1;
        iVar6 = 0;
        bVar2 = 1;
      }
      else {
LAB_00d62110:
        std::operator<<(&local_1a8,cVar3);
        bVar2 = 0;
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

string ShaderParser::parseShaderSource(const char* str)
{
	const char*   p = str + 2;
	ostringstream o;

	// Eat first empty line from beginning.
	while (*p == ' ')
		p++;
	while (isEOL(*p))
		p++;

	while ((p[0] != '"') || (p[1] != '"'))
	{
		if (*p == '\\')
		{
			switch (p[1])
			{
			case 0:
				DE_ASSERT(DE_FALSE);
				break;
			case 'n':
				o << '\n';
				break;
			case 't':
				o << '\t';
				break;
			default:
				o << p[1];
				break;
			}

			p += 2;
		}
		else
			o << *p++;
	}

	return removeExtraIndentation(o.str());
}